

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool __thiscall tinyusdz::Stage::find_prim_at_path(Stage *this,Path *path,Prim **prim,string *err)

{
  bool bVar1;
  value_type *ppPVar2;
  error_type *peVar3;
  undefined1 local_58 [8];
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  string *err_local;
  Prim **prim_local;
  Path *path_local;
  Stage *this_local;
  
  ret.contained.
  super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = err;
  GetPrimAtPath_abi_cxx11_
            ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_58,this,path);
  bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_58);
  if (bVar1) {
    ppPVar2 = nonstd::expected_lite::
              expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_58);
    *prim = *ppPVar2;
    this_local._7_1_ = true;
  }
  else {
    if (ret.contained.
        super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._32_8_ != 0) {
      peVar3 = nonstd::expected_lite::
               expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_58);
      ::std::__cxx11::string::operator=
                ((string *)
                 ret.contained.
                 super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._32_8_,(string *)peVar3);
    }
    this_local._7_1_ = false;
  }
  nonstd::expected_lite::
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_58);
  return this_local._7_1_;
}

Assistant:

bool Stage::find_prim_at_path(const Path &path, const Prim *&prim,
                              std::string *err) const {
  nonstd::expected<const Prim *, std::string> ret = GetPrimAtPath(path);
  if (ret) {
    prim = ret.value();
    return true;
  } else {
    if (err) {
      (*err) = ret.error();
    }
    return false;
  }
}